

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

void defilter_avg3(size_t rowbytes,uchar *row,uchar *prev)

{
  char cVar1;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  ulong extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  char cVar9;
  ulong uVar2;
  undefined8 extraout_XMM0_Qa_01;
  char cVar10;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  ulong extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  char cVar18;
  ulong uVar11;
  undefined8 extraout_XMM0_Qb_01;
  __m128i alVar19;
  __m128i v;
  __m128i avg_1;
  __m128i avg;
  __m128i d;
  __m128i a;
  __m128i b;
  __m128i zero;
  size_t rb;
  uchar *prev_local;
  uchar *row_local;
  size_t rowbytes_local;
  char local_168;
  char cStack_167;
  char cStack_166;
  char cStack_165;
  char cStack_164;
  char cStack_163;
  char cStack_162;
  char cStack_161;
  char cStack_160;
  char cStack_15f;
  char cStack_15e;
  char cStack_15d;
  char cStack_15c;
  char cStack_15b;
  char cStack_15a;
  char cStack_159;
  undefined1 local_158;
  undefined1 uStack_157;
  undefined1 uStack_156;
  undefined1 uStack_155;
  undefined1 uStack_154;
  undefined1 uStack_153;
  undefined1 uStack_152;
  undefined1 uStack_151;
  undefined1 uStack_150;
  undefined1 uStack_14f;
  undefined1 uStack_14e;
  undefined1 uStack_14d;
  undefined1 uStack_14c;
  undefined1 uStack_14b;
  undefined1 uStack_14a;
  undefined1 uStack_149;
  undefined1 local_138;
  undefined1 uStack_137;
  undefined1 uStack_136;
  undefined1 uStack_135;
  undefined1 uStack_134;
  undefined1 uStack_133;
  undefined1 uStack_132;
  undefined1 uStack_131;
  undefined1 uStack_130;
  undefined1 uStack_12f;
  undefined1 uStack_12e;
  undefined1 uStack_12d;
  undefined1 uStack_12c;
  undefined1 uStack_12b;
  undefined1 uStack_12a;
  undefined1 uStack_129;
  undefined1 local_128;
  undefined1 uStack_127;
  undefined1 uStack_126;
  undefined1 uStack_125;
  undefined1 uStack_124;
  undefined1 uStack_123;
  undefined1 uStack_122;
  undefined1 uStack_121;
  undefined1 uStack_120;
  undefined1 uStack_11f;
  undefined1 uStack_11e;
  undefined1 uStack_11d;
  undefined1 uStack_11c;
  undefined1 uStack_11b;
  undefined1 uStack_11a;
  undefined1 uStack_119;
  char local_f8;
  char cStack_f7;
  char cStack_f6;
  char cStack_f5;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  char cStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  char cStack_e9;
  
  avg[1] = 0;
  d[0] = 0;
  rb = (size_t)prev;
  prev_local = row;
  for (zero[1] = rowbytes; local_128 = (undefined1)avg[1],
      uStack_127 = (undefined1)((ulong)avg[1] >> 8),
      uStack_126 = (undefined1)((ulong)avg[1] >> 0x10),
      uStack_125 = (undefined1)((ulong)avg[1] >> 0x18),
      uStack_124 = (undefined1)((ulong)avg[1] >> 0x20),
      uStack_123 = (undefined1)((ulong)avg[1] >> 0x28),
      uStack_122 = (undefined1)((ulong)avg[1] >> 0x30),
      uStack_121 = (undefined1)((ulong)avg[1] >> 0x38), uStack_120 = (undefined1)d[0],
      uStack_11f = (undefined1)((ulong)d[0] >> 8), uStack_11e = (undefined1)((ulong)d[0] >> 0x10),
      uStack_11d = (undefined1)((ulong)d[0] >> 0x18), uStack_11c = (undefined1)((ulong)d[0] >> 0x20)
      , uStack_11b = (undefined1)((ulong)d[0] >> 0x28),
      uStack_11a = (undefined1)((ulong)d[0] >> 0x30), uStack_119 = (undefined1)((ulong)d[0] >> 0x38)
      , 3 < (ulong)zero[1]; zero[1] = zero[1] + -3) {
    load4((void *)rb);
    alVar19 = load4(prev_local);
    v[1] = alVar19[1];
    local_138 = (undefined1)extraout_XMM0_Qa;
    uStack_137 = (undefined1)(extraout_XMM0_Qa >> 8);
    uStack_136 = (undefined1)(extraout_XMM0_Qa >> 0x10);
    uStack_135 = (undefined1)(extraout_XMM0_Qa >> 0x18);
    uStack_134 = (undefined1)(extraout_XMM0_Qa >> 0x20);
    uStack_133 = (undefined1)(extraout_XMM0_Qa >> 0x28);
    uStack_132 = (undefined1)(extraout_XMM0_Qa >> 0x30);
    uStack_131 = (undefined1)(extraout_XMM0_Qa >> 0x38);
    uStack_130 = (undefined1)extraout_XMM0_Qb;
    uStack_12f = (undefined1)(extraout_XMM0_Qb >> 8);
    uStack_12e = (undefined1)(extraout_XMM0_Qb >> 0x10);
    uStack_12d = (undefined1)(extraout_XMM0_Qb >> 0x18);
    uStack_12c = (undefined1)(extraout_XMM0_Qb >> 0x20);
    uStack_12b = (undefined1)(extraout_XMM0_Qb >> 0x28);
    uStack_12a = (undefined1)(extraout_XMM0_Qb >> 0x30);
    uStack_129 = (undefined1)(extraout_XMM0_Qb >> 0x38);
    cVar1 = pavgb(local_128,local_138);
    cVar3 = pavgb(uStack_127,uStack_137);
    cVar4 = pavgb(uStack_126,uStack_136);
    cVar5 = pavgb(uStack_125,uStack_135);
    cVar6 = pavgb(uStack_124,uStack_134);
    cVar7 = pavgb(uStack_123,uStack_133);
    cVar8 = pavgb(uStack_122,uStack_132);
    cVar9 = pavgb(uStack_121,uStack_131);
    cVar10 = pavgb(uStack_120,uStack_130);
    cVar12 = pavgb(uStack_11f,uStack_12f);
    cVar13 = pavgb(uStack_11e,uStack_12e);
    cVar14 = pavgb(uStack_11d,uStack_12d);
    cVar15 = pavgb(uStack_11c,uStack_12c);
    cVar16 = pavgb(uStack_11b,uStack_12b);
    cVar17 = pavgb(uStack_11a,uStack_12a);
    cVar18 = pavgb(uStack_119,uStack_129);
    uVar2 = (avg[1] ^ extraout_XMM0_Qa) & 0x101010101010101;
    uVar11 = (d[0] ^ extraout_XMM0_Qb) & 0x101010101010101;
    local_f8 = (char)uVar2;
    cStack_f7 = (char)(uVar2 >> 8);
    cStack_f6 = (char)(uVar2 >> 0x10);
    cStack_f5 = (char)(uVar2 >> 0x18);
    cStack_f4 = (char)(uVar2 >> 0x20);
    cStack_f3 = (char)(uVar2 >> 0x28);
    cStack_f2 = (char)(uVar2 >> 0x30);
    cStack_f1 = (char)(uVar2 >> 0x38);
    cStack_f0 = (char)uVar11;
    cStack_ef = (char)(uVar11 >> 8);
    cStack_ee = (char)(uVar11 >> 0x10);
    cStack_ed = (char)(uVar11 >> 0x18);
    cStack_ec = (char)(uVar11 >> 0x20);
    cStack_eb = (char)(uVar11 >> 0x28);
    cStack_ea = (char)(uVar11 >> 0x30);
    cStack_e9 = (char)(uVar11 >> 0x38);
    local_168 = (char)extraout_XMM0_Qa_00;
    cStack_167 = (char)((ulong)extraout_XMM0_Qa_00 >> 8);
    cStack_166 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x10);
    cStack_165 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x18);
    cStack_164 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    cStack_163 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x28);
    cStack_162 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x30);
    cStack_161 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x38);
    cStack_160 = (char)extraout_XMM0_Qb_00;
    cStack_15f = (char)((ulong)extraout_XMM0_Qb_00 >> 8);
    cStack_15e = (char)((ulong)extraout_XMM0_Qb_00 >> 0x10);
    cStack_15d = (char)((ulong)extraout_XMM0_Qb_00 >> 0x18);
    cStack_15c = (char)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    cStack_15b = (char)((ulong)extraout_XMM0_Qb_00 >> 0x28);
    cStack_15a = (char)((ulong)extraout_XMM0_Qb_00 >> 0x30);
    cStack_159 = (char)((ulong)extraout_XMM0_Qb_00 >> 0x38);
    avg[1] = CONCAT17(cStack_161 + (cVar9 - cStack_f1),
                      CONCAT16(cStack_162 + (cVar8 - cStack_f2),
                               CONCAT15(cStack_163 + (cVar7 - cStack_f3),
                                        CONCAT14(cStack_164 + (cVar6 - cStack_f4),
                                                 CONCAT13(cStack_165 + (cVar5 - cStack_f5),
                                                          CONCAT12(cStack_166 + (cVar4 - cStack_f6),
                                                                   CONCAT11(cStack_167 +
                                                                            (cVar3 - cStack_f7),
                                                                            local_168 +
                                                                            (cVar1 - local_f8)))))))
                     );
    d[0] = CONCAT17(cStack_159 + (cVar18 - cStack_e9),
                    CONCAT16(cStack_15a + (cVar17 - cStack_ea),
                             CONCAT15(cStack_15b + (cVar16 - cStack_eb),
                                      CONCAT14(cStack_15c + (cVar15 - cStack_ec),
                                               CONCAT13(cStack_15d + (cVar14 - cStack_ed),
                                                        CONCAT12(cStack_15e + (cVar13 - cStack_ee),
                                                                 CONCAT11(cStack_15f +
                                                                          (cVar12 - cStack_ef),
                                                                          cStack_160 +
                                                                          (cVar10 - cStack_f0)))))))
                   );
    v[0] = (longlong)row;
    store3(prev_local,v);
    rb = rb + 3;
    prev_local = prev_local + 3;
  }
  if (zero[1] != 0) {
    load3((void *)rb);
    alVar19 = load3(prev_local);
    local_158 = (undefined1)extraout_XMM0_Qa_01;
    uStack_157 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 8);
    uStack_156 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x10);
    uStack_155 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x18);
    uStack_154 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x20);
    uStack_153 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x28);
    uStack_152 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x30);
    uStack_151 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x38);
    uStack_150 = (undefined1)extraout_XMM0_Qb_01;
    uStack_14f = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 8);
    uStack_14e = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x10);
    uStack_14d = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x18);
    uStack_14c = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x20);
    uStack_14b = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x28);
    uStack_14a = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x30);
    uStack_149 = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x38);
    pavgb(local_128,local_158);
    pavgb(uStack_127,uStack_157);
    pavgb(uStack_126,uStack_156);
    pavgb(uStack_125,uStack_155);
    pavgb(uStack_124,uStack_154);
    pavgb(uStack_123,uStack_153);
    pavgb(uStack_122,uStack_152);
    pavgb(uStack_121,uStack_151);
    pavgb(uStack_120,uStack_150);
    pavgb(uStack_11f,uStack_14f);
    pavgb(uStack_11e,uStack_14e);
    pavgb(uStack_11d,uStack_14d);
    pavgb(uStack_11c,uStack_14c);
    pavgb(uStack_11b,uStack_14b);
    pavgb(uStack_11a,uStack_14a);
    pavgb(uStack_119,uStack_149);
    alVar19[0] = (longlong)row;
    store3(prev_local,alVar19);
  }
  return;
}

Assistant:

static void defilter_avg3(size_t rowbytes, unsigned char *row, const unsigned char *prev)
{
    /* The Avg filter predicts each pixel as the (truncated) average of a and b.
     * There's no pixel to the left of the first pixel.  Luckily, it's
     * predicted to be half of the pixel above it.  So again, this works
     * perfectly with our loop if we make sure a starts at zero.
     */

    size_t rb = rowbytes;

    const __m128i zero = _mm_setzero_si128();

    __m128i b;
    __m128i a, d = zero;

    while(rb >= 4)
    {
        __m128i avg;
               b = load4(prev);
        a = d; d = load4(row );

        /* PNG requires a truncating average, so we can't just use _mm_avg_epu8 */
        avg = _mm_avg_epu8(a,b);
        /* ...but we can fix it up by subtracting off 1 if it rounded up. */
        avg = _mm_sub_epi8(avg, _mm_and_si128(_mm_xor_si128(a, b),
                                            _mm_set1_epi8(1)));
        d = _mm_add_epi8(d, avg);
        store3(row, d);

        prev += 3;
        row  += 3;
        rb   -= 3;
    }

    if(rb > 0)
    {
        __m128i avg;
               b = load3(prev);
        a = d; d = load3(row );

        /* PNG requires a truncating average, so we can't just use _mm_avg_epu8 */
        avg = _mm_avg_epu8(a, b);
        /* ...but we can fix it up by subtracting off 1 if it rounded up. */
        avg = _mm_sub_epi8(avg, _mm_and_si128(_mm_xor_si128(a, b),
                                            _mm_set1_epi8(1)));

        d = _mm_add_epi8(d, avg);
        store3(row, d);
    }
}